

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

format_arg * __thiscall
fmt::v5::
basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::get(format_arg *__return_storage_ptr__,
     basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
     *this,size_type index)

{
  undefined4 uVar1;
  type tVar2;
  long lVar3;
  undefined8 uVar4;
  
  do_get(__return_storage_ptr__,this,index);
  if (__return_storage_ptr__->type_ == named_arg_type) {
    lVar3 = (__return_storage_ptr__->value_).field_0.long_long_value;
    uVar1 = *(undefined4 *)(lVar3 + 0x1c);
    uVar4 = *(undefined8 *)(lVar3 + 0x14);
    tVar2 = *(type *)(lVar3 + 0x20);
    (__return_storage_ptr__->value_).field_0.int_value = *(int *)(lVar3 + 0x10);
    *(undefined4 *)((long)&(__return_storage_ptr__->value_).field_0 + 0xc) = uVar1;
    *(undefined8 *)((long)&(__return_storage_ptr__->value_).field_0.string.value + 4) = uVar4;
    __return_storage_ptr__->type_ = tVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

format_arg get(size_type index) const {
    format_arg arg = do_get(index);
    if (arg.type_ == internal::named_arg_type)
      arg = arg.value_.as_named_arg().template deserialize<Context>();
    return arg;
  }